

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.c
# Opt level: O1

int enet_protocol_send_outgoing_commands(ENetHost *host,ENetEvent *event,int checkForTimeouts)

{
  byte *pbVar1;
  ENetList *pEVar2;
  ENetList *pEVar3;
  enet_uint32 eVar4;
  _ENetListNode *p_Var5;
  ENetListIterator position;
  _ENetListNode *p_Var6;
  _func_size_t_void_ptr_ENetBuffer_ptr_size_t_size_t_enet_uint8_ptr_size_t *p_Var7;
  ENetChecksumCallback p_Var8;
  size_t sVar9;
  ENetPacket *packet;
  ENetEvent *pEVar10;
  ushort uVar11;
  ushort uVar12;
  int iVar13;
  void *pvVar14;
  size_t sVar15;
  enet_uint32 eVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  ENetListIterator pEVar20;
  long lVar21;
  ENetPeer *peer;
  enet_uint8 headerData [8];
  undefined4 local_64;
  int local_5c;
  ENetEvent *local_58;
  enet_uint8 (*local_50) [4096];
  ENetBuffer *local_48;
  ENetBuffer *local_40;
  _ENetListNode *local_38;
  
  host->continueSending = 1;
  local_48 = host->buffers;
  local_40 = host->buffers + 1;
  local_50 = host->packetData + 1;
  local_5c = checkForTimeouts;
  local_58 = event;
  do {
    host->continueSending = 0;
    if (0 < (long)host->peerCount) {
      peer = host->peers;
      do {
        if ((peer->state != ENET_PEER_STATE_DISCONNECTED) && (peer->state != ENET_PEER_STATE_ZOMBIE)
           ) {
          host->headerFlags = 0;
          host->commandCount = 0;
          host->bufferCount = 1;
          host->packetSize = 4;
          local_38 = &(peer->acknowledgements).sentinel;
          pEVar20 = (peer->acknowledgements).sentinel.next;
          if (pEVar20 != local_38) {
            lVar21 = 0x688;
            uVar19 = 0x6a;
            do {
              if (0x669 < uVar19) {
                lVar21 = 0x888;
                uVar19 = 0x66a;
LAB_001602c3:
                host->continueSending = 1;
                break;
              }
              sVar15 = host->packetSize;
              if (peer->mtu - sVar15 < 8) goto LAB_001602c3;
              p_Var5 = pEVar20->next;
              *(ulong *)((long)host->commands + lVar21 + -0x6a) =
                   (long)host->commands + (uVar19 - 0x6a);
              *(undefined8 *)((long)host->commands + lVar21 + -0x62) = 8;
              host->packetSize = sVar15 + 8;
              uVar11 = *(ushort *)((long)&pEVar20[1].next + 6);
              uVar11 = uVar11 << 8 | uVar11 >> 8;
              *(undefined1 *)((long)host->commands + (uVar19 - 0x6a)) = 1;
              *(undefined1 *)((long)host->commands + (uVar19 - 0x69)) =
                   *(undefined1 *)((long)&pEVar20[1].next + 5);
              *(ushort *)((long)host->commands + (uVar19 - 0x68)) = uVar11;
              *(ushort *)((long)host->commands + (uVar19 - 0x66)) = uVar11;
              *(ushort *)((long)host->commands + (uVar19 - 100)) =
                   *(ushort *)&pEVar20[1].next << 8 | *(ushort *)&pEVar20[1].next >> 8;
              if (((ulong)pEVar20[1].next & 0xf00000000) == 0x400000000) {
                enet_protocol_dispatch_state(host,peer,ENET_PEER_STATE_ZOMBIE);
              }
              enet_list_remove(pEVar20);
              enet_free(pEVar20);
              uVar19 = uVar19 + 0x30;
              lVar21 = lVar21 + 0x10;
              pEVar20 = p_Var5;
            } while (p_Var5 != local_38);
            host->commandCount = ((long)(uVar19 - 0x6a) >> 4) * -0x5555555555555555;
            host->bufferCount = lVar21 + -0x678 >> 4;
          }
          if (local_5c != 0) {
            pEVar2 = &peer->sentReliableCommands;
            pEVar20 = (peer->sentReliableCommands).sentinel.next;
            if ((pEVar20 != &pEVar2->sentinel) && (host->serviceTime - peer->nextTimeout < 86400000)
               ) {
              position = (peer->outgoingCommands).sentinel.next;
              do {
                pEVar10 = local_58;
                p_Var5 = pEVar20->next;
                eVar16 = host->serviceTime;
                eVar4 = *(enet_uint32 *)((long)&pEVar20[1].next + 4);
                uVar17 = eVar4 - eVar16;
                if (eVar16 - eVar4 < 86400000) {
                  uVar17 = eVar16 - eVar4;
                }
                uVar18 = *(uint *)&pEVar20[1].previous;
                if (uVar18 <= uVar17) {
                  if ((peer->earliestTimeout == 0) || (86399999 < eVar4 - peer->earliestTimeout)) {
                    peer->earliestTimeout = eVar4;
                  }
                  eVar4 = peer->earliestTimeout;
                  if (eVar4 != 0) {
                    uVar17 = eVar4 - eVar16;
                    if (eVar16 - eVar4 < 86400000) {
                      uVar17 = eVar16 - eVar4;
                    }
                    if ((peer->timeoutMaximum <= uVar17) ||
                       ((*(uint *)((long)&pEVar20[1].previous + 4) <= uVar18 &&
                        (peer->timeoutMinimum <= uVar17)))) {
                      enet_protocol_notify_disconnect(host,peer,local_58);
                      if ((pEVar10 != (ENetEvent *)0x0) && (local_58->type != ENET_EVENT_TYPE_NONE))
                      {
                        return 1;
                      }
                      goto LAB_001606de;
                    }
                  }
                  if (pEVar20[5].previous != (_ENetListNode *)0x0) {
                    peer->reliableDataInTransit =
                         peer->reliableDataInTransit - (uint)*(ushort *)((long)&pEVar20[2].next + 4)
                    ;
                  }
                  peer->packetsLost = peer->packetsLost + 1;
                  *(uint *)&pEVar20[1].previous = uVar18 * 2;
                  pvVar14 = enet_list_remove(pEVar20);
                  enet_list_insert(position,pvVar14);
                  p_Var6 = (peer->sentReliableCommands).sentinel.next;
                  if (p_Var6 != &pEVar2->sentinel && p_Var5 == p_Var6) {
                    peer->nextTimeout =
                         *(int *)&p_Var5[1].previous + *(int *)((long)&p_Var5[1].next + 4);
                  }
                }
                pEVar20 = p_Var5;
              } while (p_Var5 != &pEVar2->sentinel);
            }
          }
          pEVar2 = &peer->outgoingCommands;
          if ((((peer->outgoingCommands).sentinel.next == &pEVar2->sentinel) ||
              (iVar13 = enet_protocol_check_outgoing_commands(host,peer), iVar13 != 0)) &&
             ((peer->sentReliableCommands).sentinel.next == &(peer->sentReliableCommands).sentinel))
          {
            uVar18 = host->serviceTime - peer->lastReceiveTime;
            uVar17 = peer->lastReceiveTime - host->serviceTime;
            if (uVar18 < 86400000) {
              uVar17 = uVar18;
            }
            if ((peer->pingInterval <= uVar17) && (3 < (ulong)peer->mtu - host->packetSize)) {
              enet_peer_ping(peer);
              enet_protocol_check_outgoing_commands(host,peer);
            }
          }
          if (host->commandCount != 0) {
            eVar16 = peer->packetLossEpoch;
            if (eVar16 == 0) {
              peer->packetLossEpoch = host->serviceTime;
            }
            else {
              eVar4 = host->serviceTime;
              uVar17 = eVar16 - eVar4;
              if (eVar4 - eVar16 < 86400000) {
                uVar17 = eVar4 - eVar16;
              }
              if ((9999 < uVar17) && (peer->packetsSent != 0)) {
                uVar17 = peer->packetLoss;
                uVar18 = (peer->packetsLost << 0x10) / peer->packetsSent;
                iVar13 = uVar18 - uVar17;
                if (uVar18 < uVar17) {
                  iVar13 = -(uVar18 - uVar17);
                }
                peer->packetLossVariance = iVar13 + peer->packetLossVariance * 3 >> 2;
                peer->packetLoss = uVar17 * 7 + uVar18 >> 3;
                peer->packetLossEpoch = eVar4;
                peer->packetsSent = 0;
                peer->packetsLost = 0;
              }
            }
            host->buffers[0].data = &local_64;
            if ((short)host->headerFlags < 0) {
              uVar11 = (ushort)host->serviceTime;
              local_64._2_2_ = uVar11 << 8 | uVar11 >> 8;
              host->buffers[0].dataLength = 4;
            }
            else {
              host->buffers[0].dataLength = 2;
            }
            pvVar14 = (host->compressor).context;
            if ((pvVar14 == (void *)0x0) ||
               (p_Var7 = (host->compressor).compress,
               p_Var7 == (_func_size_t_void_ptr_ENetBuffer_ptr_size_t_size_t_enet_uint8_ptr_size_t *
                         )0x0)) {
LAB_001605a8:
              sVar15 = 0;
            }
            else {
              uVar19 = host->packetSize - 4;
              sVar15 = (*p_Var7)(pvVar14,local_40,host->bufferCount - 1,uVar19,*local_50,uVar19);
              if (uVar19 <= sVar15 || sVar15 == 0) goto LAB_001605a8;
              pbVar1 = (byte *)((long)&host->headerFlags + 1);
              *pbVar1 = *pbVar1 | 0x40;
            }
            uVar11 = peer->outgoingPeerID;
            if (uVar11 < 0xfff) {
              iVar13._0_1_ = peer->outgoingSessionID;
              iVar13._1_1_ = peer->incomingSessionID;
              iVar13._2_2_ = *(undefined2 *)&peer->field_0x22;
              host->headerFlags = host->headerFlags | (ushort)(iVar13 << 0xc);
            }
            uVar12 = host->headerFlags | uVar11;
            local_64._0_2_ = uVar12 << 8 | uVar12 >> 8;
            p_Var8 = host->checksum;
            if (p_Var8 != (ENetChecksumCallback)0x0) {
              eVar16 = 0;
              if (uVar11 < 0xfff) {
                eVar16 = peer->connectID;
              }
              sVar9 = host->buffers[0].dataLength;
              *(enet_uint32 *)((long)&local_64 + sVar9) = eVar16;
              host->buffers[0].dataLength = sVar9 + 4;
              eVar16 = (*p_Var8)(local_48,host->bufferCount);
              *(enet_uint32 *)((long)&local_64 + sVar9) = eVar16;
            }
            if (sVar15 != 0) {
              host->buffers[1].data = local_50;
              host->buffers[1].dataLength = sVar15;
              host->bufferCount = 2;
            }
            peer->lastSendTime = host->serviceTime;
            iVar13 = enet_socket_send(host->socket,&peer->address,local_48,host->bufferCount);
            pEVar3 = &peer->sentUnreliableCommands;
            if ((peer->sentUnreliableCommands).sentinel.next != &pEVar3->sentinel) {
              do {
                pEVar20 = (pEVar3->sentinel).next;
                enet_list_remove(pEVar20);
                packet = (ENetPacket *)pEVar20[5].previous;
                if ((packet != (ENetPacket *)0x0) &&
                   (packet->referenceCount = packet->referenceCount - 1, packet->referenceCount == 0
                   )) {
                  pbVar1 = (byte *)((long)&packet->flags + 1);
                  *pbVar1 = *pbVar1 | 1;
                  enet_packet_destroy(packet);
                }
                enet_free(pEVar20);
              } while ((pEVar3->sentinel).next != &pEVar3->sentinel);
              if (((peer->state == ENET_PEER_STATE_DISCONNECT_LATER) &&
                  ((pEVar2->sentinel).next == &pEVar2->sentinel)) &&
                 ((peer->sentReliableCommands).sentinel.next ==
                  &(peer->sentReliableCommands).sentinel)) {
                enet_peer_disconnect(peer,peer->eventData);
              }
            }
            if (iVar13 < 0) {
              return -1;
            }
            host->totalSentData = host->totalSentData + iVar13;
            host->totalSentPackets = host->totalSentPackets + 1;
          }
        }
LAB_001606de:
        peer = peer + 1;
      } while (peer < host->peers + host->peerCount);
    }
    if (host->continueSending == 0) {
      return 0;
    }
  } while( true );
}

Assistant:

static int
enet_protocol_send_outgoing_commands (ENetHost * host, ENetEvent * event, int checkForTimeouts)
{
    enet_uint8 headerData [sizeof (ENetProtocolHeader) + sizeof (enet_uint32)];
    ENetProtocolHeader * header = (ENetProtocolHeader *) headerData;
    ENetPeer * currentPeer;
    int sentLength;
    size_t shouldCompress = 0;
 
    host -> continueSending = 1;

    while (host -> continueSending)
    for (host -> continueSending = 0,
           currentPeer = host -> peers;
         currentPeer < & host -> peers [host -> peerCount];
         ++ currentPeer)
    {
        if (currentPeer -> state == ENET_PEER_STATE_DISCONNECTED ||
            currentPeer -> state == ENET_PEER_STATE_ZOMBIE)
          continue;

        host -> headerFlags = 0;
        host -> commandCount = 0;
        host -> bufferCount = 1;
        host -> packetSize = sizeof (ENetProtocolHeader);

        if (! enet_list_empty (& currentPeer -> acknowledgements))
          enet_protocol_send_acknowledgements (host, currentPeer);

        if (checkForTimeouts != 0 &&
            ! enet_list_empty (& currentPeer -> sentReliableCommands) &&
            ENET_TIME_GREATER_EQUAL (host -> serviceTime, currentPeer -> nextTimeout) &&
            enet_protocol_check_timeouts (host, currentPeer, event) == 1)
        {
            if (event != NULL && event -> type != ENET_EVENT_TYPE_NONE)
              return 1;
            else
              continue;
        }

        if ((enet_list_empty (& currentPeer -> outgoingCommands) ||
              enet_protocol_check_outgoing_commands (host, currentPeer)) &&
            enet_list_empty (& currentPeer -> sentReliableCommands) &&
            ENET_TIME_DIFFERENCE (host -> serviceTime, currentPeer -> lastReceiveTime) >= currentPeer -> pingInterval &&
            currentPeer -> mtu - host -> packetSize >= sizeof (ENetProtocolPing))
        { 
            enet_peer_ping (currentPeer);
            enet_protocol_check_outgoing_commands (host, currentPeer);
        }

        if (host -> commandCount == 0)
          continue;

        if (currentPeer -> packetLossEpoch == 0)
          currentPeer -> packetLossEpoch = host -> serviceTime;
        else
        if (ENET_TIME_DIFFERENCE (host -> serviceTime, currentPeer -> packetLossEpoch) >= ENET_PEER_PACKET_LOSS_INTERVAL &&
            currentPeer -> packetsSent > 0)
        {
           enet_uint32 packetLoss = currentPeer -> packetsLost * ENET_PEER_PACKET_LOSS_SCALE / currentPeer -> packetsSent;

#ifdef ENET_DEBUG
           printf ("peer %u: %f%%+-%f%% packet loss, %u+-%u ms round trip time, %f%% throttle, %u outgoing, %u/%u incoming\n", currentPeer -> incomingPeerID, currentPeer -> packetLoss / (float) ENET_PEER_PACKET_LOSS_SCALE, currentPeer -> packetLossVariance / (float) ENET_PEER_PACKET_LOSS_SCALE, currentPeer -> roundTripTime, currentPeer -> roundTripTimeVariance, currentPeer -> packetThrottle / (float) ENET_PEER_PACKET_THROTTLE_SCALE, enet_list_size (& currentPeer -> outgoingCommands), currentPeer -> channels != NULL ? enet_list_size (& currentPeer -> channels -> incomingReliableCommands) : 0, currentPeer -> channels != NULL ? enet_list_size (& currentPeer -> channels -> incomingUnreliableCommands) : 0);
#endif

           currentPeer -> packetLossVariance = (currentPeer -> packetLossVariance * 3 + ENET_DIFFERENCE (packetLoss, currentPeer -> packetLoss)) / 4;
           currentPeer -> packetLoss = (currentPeer -> packetLoss * 7 + packetLoss) / 8;

           currentPeer -> packetLossEpoch = host -> serviceTime;
           currentPeer -> packetsSent = 0;
           currentPeer -> packetsLost = 0;
        }

        host -> buffers -> data = headerData;
        if (host -> headerFlags & ENET_PROTOCOL_HEADER_FLAG_SENT_TIME)
        {
            header -> sentTime = ENET_HOST_TO_NET_16 (host -> serviceTime & 0xFFFF);

            host -> buffers -> dataLength = sizeof (ENetProtocolHeader);
        }
        else
          host -> buffers -> dataLength = (size_t) & ((ENetProtocolHeader *) 0) -> sentTime;

        shouldCompress = 0;
        if (host -> compressor.context != NULL && host -> compressor.compress != NULL)
        {
            size_t originalSize = host -> packetSize - sizeof(ENetProtocolHeader),
                   compressedSize = host -> compressor.compress (host -> compressor.context,
                                        & host -> buffers [1], host -> bufferCount - 1,
                                        originalSize,
                                        host -> packetData [1],
                                        originalSize);
            if (compressedSize > 0 && compressedSize < originalSize)
            {
                host -> headerFlags |= ENET_PROTOCOL_HEADER_FLAG_COMPRESSED;
                shouldCompress = compressedSize;
#ifdef ENET_DEBUG_COMPRESS
                printf ("peer %u: compressed %u -> %u (%u%%)\n", currentPeer -> incomingPeerID, originalSize, compressedSize, (compressedSize * 100) / originalSize);
#endif
            }
        }

        if (currentPeer -> outgoingPeerID < ENET_PROTOCOL_MAXIMUM_PEER_ID)
          host -> headerFlags |= currentPeer -> outgoingSessionID << ENET_PROTOCOL_HEADER_SESSION_SHIFT;
        header -> peerID = ENET_HOST_TO_NET_16 (currentPeer -> outgoingPeerID | host -> headerFlags);
        if (host -> checksum != NULL)
        {
            enet_uint32 * checksum = (enet_uint32 *) & headerData [host -> buffers -> dataLength];
            * checksum = currentPeer -> outgoingPeerID < ENET_PROTOCOL_MAXIMUM_PEER_ID ? currentPeer -> connectID : 0;
            host -> buffers -> dataLength += sizeof (enet_uint32);
            * checksum = host -> checksum (host -> buffers, host -> bufferCount);
        }

        if (shouldCompress > 0)
        {
            host -> buffers [1].data = host -> packetData [1];
            host -> buffers [1].dataLength = shouldCompress;
            host -> bufferCount = 2;
        }

        currentPeer -> lastSendTime = host -> serviceTime;

        sentLength = enet_socket_send (host -> socket, & currentPeer -> address, host -> buffers, host -> bufferCount);

        enet_protocol_remove_sent_unreliable_commands (currentPeer);

        if (sentLength < 0)
          return -1;

        host -> totalSentData += sentLength;
        host -> totalSentPackets ++;
    }
   
    return 0;
}